

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isnan.c
# Opt level: O0

int signbit(double x)

{
  anon_union_8_3_4e90a44e u;
  double x_local;
  
  return (int)((long)x < 0);
}

Assistant:

int signbit(x)
double x;
{
union
	{
	double d;
	short s[4];
	int i[2];
	} u;

u.d = x;

if( sizeof(int) == 4 )
	{
#ifdef IBMPC
	return( u.i[1] < 0 );
#endif
#ifdef DEC
	return( u.s[3] < 0 );
#endif
#ifdef MIEEE
	return( u.i[0] < 0 );
#endif
	}
else
	{
#ifdef IBMPC
	return( u.s[3] < 0 );
#endif
#ifdef DEC
	return( u.s[3] < 0 );
#endif
#ifdef MIEEE
	return( u.s[0] < 0 );
#endif
	}
}